

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O2

void evutil_usleep_(timeval *tv)

{
  timespec ts;
  timespec local_10;
  
  if (tv != (timeval *)0x0) {
    local_10.tv_sec = tv->tv_sec;
    local_10.tv_nsec = tv->tv_usec * 1000;
    nanosleep(&local_10,(timespec *)0x0);
  }
  return;
}

Assistant:

void
evutil_usleep_(const struct timeval *tv)
{
	if (!tv)
		return;
#if defined(_WIN32)
	{
		long msec = evutil_tv_to_msec_(tv);
		Sleep((DWORD)msec);
	}
#elif defined(EVENT__HAVE_NANOSLEEP)
	{
		struct timespec ts;
		ts.tv_sec = tv->tv_sec;
		ts.tv_nsec = tv->tv_usec*1000;
		nanosleep(&ts, NULL);
	}
#elif defined(EVENT__HAVE_USLEEP)
	/* Some systems don't like to usleep more than 999999 usec */
	sleep(tv->tv_sec);
	usleep(tv->tv_usec);
#else
	{
		struct timeval tv2 = *tv;
		select(0, NULL, NULL, NULL, &tv2);
	}
#endif
}